

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O3

void FAudio_INTERNAL_DecodeStereoMSADPCM
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  byte *local_1058;
  int local_1028;
  undefined8 local_1008;
  undefined2 auStack_1000 [2024];
  
  if (samples != 0) {
    uVar10 = (uint)((voice->field_18).src.format)->nBlockAlign;
    uVar18 = (uVar10 & 0xfffffffe) - 0xc;
    uVar13 = (voice->field_18).src.curBufferOffset;
    uVar21 = (ulong)uVar13 % (ulong)uVar18;
    uVar14 = 0;
    local_1058 = buffer->pAudioData + (uVar13 / uVar18) * uVar10;
    do {
      uVar13 = uVar18 - (int)uVar21;
      if (samples - uVar14 < uVar13) {
        uVar13 = samples - uVar14;
      }
      uVar4 = ((voice->field_18).src.format)->nBlockAlign;
      pbVar1 = local_1058 + 0xe;
      bVar3 = *local_1058;
      pbVar2 = local_1058 + 1;
      uVar10 = (uint)*(ushort *)(local_1058 + 2);
      uVar20 = (uint)*(ushort *)(local_1058 + 4);
      uVar12 = *(ulong *)(local_1058 + 6);
      local_1008 = CONCAT44((int)uVar12,(int)(uVar12 >> 0x20));
      local_1058 = pbVar1;
      if (uVar4 != 0xe) {
        iVar5 = *(int *)(FAudio_INTERNAL_ParseNibble_AdaptCoeff_1 + (ulong)bVar3 * 4);
        iVar6 = *(int *)(FAudio_INTERNAL_ParseNibble_AdaptCoeff_2 + (ulong)bVar3 * 4);
        iVar7 = *(int *)(FAudio_INTERNAL_ParseNibble_AdaptCoeff_1 + (ulong)*pbVar2 * 4);
        iVar8 = *(int *)(FAudio_INTERNAL_ParseNibble_AdaptCoeff_2 + (ulong)*pbVar2 * 4);
        uVar24 = uVar12 >> 0x30;
        local_1028 = uVar4 - 0xe;
        lVar25 = 0;
        uVar11 = uVar12 >> 0x20 & 0xffff;
        uVar22 = uVar12 & 0xffffffff;
        uVar17 = (uint)(ushort)(uVar12 >> 0x10);
        do {
          uVar15 = (uint)(pbVar1[lVar25] >> 4);
          uVar12 = (ulong)(uVar15 - 0x10 & 0xff);
          if (-1 < (char)pbVar1[lVar25]) {
            uVar12 = (ulong)uVar15;
          }
          iVar9 = (short)uVar11 * iVar6 + (short)uVar22 * iVar5;
          iVar19 = iVar9 + 0xff;
          if (-1 < iVar9) {
            iVar19 = iVar9;
          }
          uVar23 = (int)(char)uVar12 * (int)(short)uVar10 + (iVar19 >> 8);
          if ((int)uVar23 < -0x7fff) {
            uVar23 = 0xffff8000;
          }
          if (0x7ffe < (int)uVar23) {
            uVar23 = 0x7fff;
          }
          uVar10 = (int)(short)uVar10 *
                   *(int *)(FAudio_INTERNAL_ParseNibble_AdaptionTable + (ulong)uVar15 * 4);
          uVar15 = uVar10 + 0xff;
          if (-1 < (int)uVar10) {
            uVar15 = uVar10;
          }
          uVar10 = uVar15 >> 8;
          if ((short)(uVar15 >> 8) < 0x11) {
            uVar10 = 0x10;
          }
          auStack_1000[lVar25 * 2] = (short)uVar23;
          uVar15 = pbVar1[lVar25] & 0xf;
          iVar9 = (short)uVar24 * iVar8 + (short)uVar17 * iVar7;
          iVar19 = iVar9 + 0xff;
          if (-1 < iVar9) {
            iVar19 = iVar9;
          }
          uVar16 = (int)(char)((char)(pbVar1[lVar25] << 4) >> 7 & 0xf0U | (byte)uVar15) *
                   (int)(short)uVar20 + (iVar19 >> 8);
          if ((int)uVar16 < -0x7fff) {
            uVar16 = 0xffff8000;
          }
          if (0x7ffe < (int)uVar16) {
            uVar16 = 0x7fff;
          }
          uVar20 = (int)(short)uVar20 *
                   *(int *)(FAudio_INTERNAL_ParseNibble_AdaptionTable + (ulong)uVar15 * 4);
          uVar15 = uVar20 + 0xff;
          if (-1 < (int)uVar20) {
            uVar15 = uVar20;
          }
          uVar24 = (ulong)uVar17;
          uVar20 = uVar15 >> 8;
          if ((short)(uVar15 >> 8) < 0x11) {
            uVar20 = 0x10;
          }
          auStack_1000[lVar25 * 2 + 1] = (short)uVar16;
          lVar25 = lVar25 + 1;
          uVar11 = uVar22;
          uVar22 = (ulong)uVar23;
          uVar17 = uVar16;
        } while (local_1028 != (int)lVar25);
        local_1058 = pbVar1 + lVar25;
      }
      (*FAudio_INTERNAL_Convert_S16_To_F32)
                ((int16_t *)((long)&local_1008 + (long)((int)uVar21 * 2) * 2),decodeCache,uVar13 * 2
                );
      decodeCache = decodeCache + uVar13 * 2;
      uVar14 = uVar14 + uVar13;
      uVar21 = 0;
    } while (uVar14 < samples);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodeStereoMSADPCM(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	/* Loop variables */
	uint32_t copy, done = 0;

	/* Read pointers */
	uint8_t *buf;
	int32_t midOffset;

	/* PCM block cache */
	int16_t blockCache[2024]; /* Max block size */

	/* Align, block size */
	uint32_t bsize = ((voice->src.format->nBlockAlign / 2) - 6) * 2;

	LOG_FUNC_ENTER(voice->audio)

	/* Where are we starting? */
	buf = (uint8_t*) buffer->pAudioData + (
		(voice->src.curBufferOffset / bsize) *
		voice->src.format->nBlockAlign
	);

	/* Are we starting in the middle? */
	midOffset = (voice->src.curBufferOffset % bsize);

	/* Read in each block directly to the decode cache */
	while (done < samples)
	{
		copy = FAudio_min(samples - done, bsize - midOffset);
		FAudio_INTERNAL_DecodeStereoMSADPCMBlock(
			&buf,
			blockCache,
			voice->src.format->nBlockAlign
		);
		FAudio_INTERNAL_Convert_S16_To_F32(
			blockCache + (midOffset * 2),
			decodeCache,
			copy * 2
		);
		decodeCache += copy * 2;
		done += copy;
		midOffset = 0;
	}
	LOG_FUNC_EXIT(voice->audio)
}